

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg-traversal.h
# Opt level: O2

void __thiscall
wasm::
CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::
doEndBranch(CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
            *this,RelevantLiveLocalsWalker *self,Expression **currp)

{
  Id IVar1;
  BranchUtils *this_00;
  size_t sVar2;
  pointer ppEVar3;
  CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
  *this_01;
  mapped_type *this_02;
  _Base_ptr p_Var4;
  BasicBlock *__from;
  uint uVar5;
  ulong uVar6;
  Expression **ppEVar7;
  char *__to;
  long lVar8;
  Expression **ppEVar9;
  Expression **ppEVar10;
  Expression *pEVar11;
  undefined1 local_70 [8];
  NameSet branchTargets;
  
  this_00 = (BranchUtils *)
            (self->
            super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
            ).
            super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
            .
            super_ControlFlowWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
            .
            super_PostWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
            .super_Walker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
            replacep;
  BranchUtils::getUniqueTargets((NameSet *)local_70,this_00,(Expression *)currp);
  p_Var4 = branchTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  do {
    if (p_Var4 == (_Rb_tree_node_base *)&branchTargets) {
      if (*(long *)(this_00 + 8) == 1) {
        this->currBasicBlock = (BasicBlock *)0x0;
      }
      else {
        this_01 = (CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
                   *)this->currBasicBlock;
        __from = startBasicBlock(this);
        link(this_01,(char *)__from,__to);
      }
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                   *)local_70);
      return;
    }
    sVar2 = (this->
            super_ControlFlowWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
            ).controlFlowStack.usedFixed;
    ppEVar3 = (this->
              super_ControlFlowWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
              ).controlFlowStack.flexible.
              super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    lVar8 = (long)(this->
                  super_ControlFlowWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                  ).controlFlowStack.flexible.
                  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)ppEVar3 >> 3;
    if (lVar8 + sVar2 == 0) {
      __assert_fail("!controlFlowStack.empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-traversal.h"
                    ,0x18b,
                    "Expression *wasm::ControlFlowWalker<RelevantLiveLocalsWalker>::findBreakTarget(Name) [SubType = RelevantLiveLocalsWalker, VisitorType = wasm::Visitor<RelevantLiveLocalsWalker>]"
                   );
    }
    uVar6 = (ulong)(((int)sVar2 + (int)lVar8) - 1);
    ppEVar7 = ppEVar3 + (uVar6 - 10);
    ppEVar9 = (this->
              super_ControlFlowWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
              ).controlFlowStack.fixed._M_elems + uVar6;
    do {
      uVar5 = (uint)uVar6;
      ppEVar10 = ppEVar7;
      if (uVar5 < 10) {
        ppEVar10 = ppEVar9;
      }
      pEVar11 = *ppEVar10;
      IVar1 = pEVar11->_id;
      if ((IVar1 != TryId) && (IVar1 != IfId)) {
        if ((IVar1 != LoopId) && (IVar1 != BlockId)) {
          __assert_fail("curr->template is<If>() || curr->template is<Try>()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-traversal.h"
                        ,0x199,
                        "Expression *wasm::ControlFlowWalker<RelevantLiveLocalsWalker>::findBreakTarget(Name) [SubType = RelevantLiveLocalsWalker, VisitorType = wasm::Visitor<RelevantLiveLocalsWalker>]"
                       );
        }
        if ((_Base_ptr)pEVar11[1].type.id == p_Var4[1]._M_parent) goto LAB_007d0896;
      }
      ppEVar7 = ppEVar7 + -1;
      ppEVar9 = ppEVar9 + -1;
      uVar6 = (ulong)(uVar5 - 1);
    } while (uVar5 != 0);
    pEVar11 = (Expression *)0x0;
LAB_007d0896:
    branchTargets._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)pEVar11;
    this_02 = std::
              map<wasm::Expression_*,_std::vector<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_std::vector<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>_>_>_>
              ::operator[](&this->branches,
                           (key_type *)
                           &branchTargets._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    vector<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
    ::push_back(this_02,&this->currBasicBlock);
    p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
  } while( true );
}

Assistant:

static void doEndBranch(SubType* self, Expression** currp) {
    auto* curr = *currp;
    auto branchTargets = BranchUtils::getUniqueTargets(curr);
    // Add branches to the targets.
    for (auto target : branchTargets) {
      self->branches[self->findBreakTarget(target)].push_back(
        self->currBasicBlock);
    }
    if (curr->type != Type::unreachable) {
      auto* last = self->currBasicBlock;
      self->link(last, self->startBasicBlock()); // we might fall through
    } else {
      self->startUnreachableBlock();
    }
  }